

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O0

void __thiscall MPL::detail::ModelPackageImpl::removeItem(ModelPackageImpl *this,string *identifier)

{
  char *__s;
  bool bVar1;
  int iVar2;
  pointer this_00;
  value_type *__filename;
  runtime_error *prVar3;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  allocator<char> local_e1;
  string local_e0;
  string local_c0;
  path local_a0;
  undefined1 local_78 [8];
  path path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_20 [8];
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> itemInfoEntry;
  string *identifier_local;
  ModelPackageImpl *this_local;
  
  itemInfoEntry._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
  super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
  super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl =
       (__uniq_ptr_data<JsonMap,_std::default_delete<JsonMap>,_true,_true>)
       (__uniq_ptr_data<JsonMap,_std::default_delete<JsonMap>,_true,_true>)identifier;
  getItemInfoEntry((ModelPackageImpl *)local_20,(string *)this);
  bVar1 = std::operator==((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_20,
                          (nullptr_t)0x0);
  if (bVar1) {
    path._35_1_ = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_40,"Failed to look up file with identifier: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   itemInfoEntry._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>.
                   _M_t.super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
                   super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl);
    std::runtime_error::runtime_error(prVar3,(string *)&local_40);
    path._35_1_ = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->
                      ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_20);
  __s = kModelPackageItemInfoPathKey;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,__s,&local_e1);
  JsonMap::getString(&local_c0,this_00,&local_e0);
  std::filesystem::__cxx11::path::path(&local_a0,&local_c0,auto_format);
  std::filesystem::__cxx11::operator/((path *)local_78,&this->m_packageDataDirPath,&local_a0);
  std::filesystem::__cxx11::path::~path(&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  __filename = std::filesystem::__cxx11::path::c_str((path *)local_78);
  iVar2 = remove(__filename);
  if (iVar2 != 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::filesystem::__cxx11::path::string(&local_128,(path *)local_78);
    std::operator+(&local_108,"Failed to remove file at path: ",&local_128);
    std::runtime_error::runtime_error(prVar3,(string *)&local_108);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  removeItemInfoEntry(this,(string *)
                           itemInfoEntry._M_t.
                           super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
                           super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
                           super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl);
  std::filesystem::__cxx11::path::~path((path *)local_78);
  std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
            ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_20);
  return;
}

Assistant:

void ModelPackageImpl::removeItem(const std::string& identifier)
{
    auto itemInfoEntry = getItemInfoEntry(identifier);
    if (itemInfoEntry == nullptr) {
        throw std::runtime_error("Failed to look up file with identifier: " + identifier);
    }
    
    auto path = m_packageDataDirPath / itemInfoEntry->getString(kModelPackageItemInfoPathKey);
    if (0 != std::remove(path.c_str())) {
        throw std::runtime_error("Failed to remove file at path: " + path.string());
    }
    
    removeItemInfoEntry(identifier);
}